

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint64_t helper_neon_abdl_u16_arm(uint32_t a,uint32_t b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = a >> 0x18;
  uVar3 = b >> 0x18;
  uVar1 = uVar3 - uVar2;
  if (uVar3 < uVar2) {
    uVar1 = -(uVar3 - uVar2);
  }
  uVar5 = a >> 0x10 & 0xff;
  uVar3 = b >> 0x10 & 0xff;
  uVar2 = uVar3 - uVar5;
  if (uVar3 < uVar5) {
    uVar2 = -(uVar3 - uVar5);
  }
  uVar6 = a >> 8 & 0xff;
  uVar5 = b >> 8 & 0xff;
  uVar3 = uVar5 - uVar6;
  if (uVar5 < uVar6) {
    uVar3 = -(uVar5 - uVar6);
  }
  uVar4 = a & 0xff;
  uVar6 = b & 0xff;
  uVar5 = uVar6 - uVar4;
  if (uVar6 < uVar4) {
    uVar5 = -(uVar6 - uVar4);
  }
  return (ulong)uVar1 << 0x30 | (ulong)uVar5 | (ulong)uVar3 << 0x10 | (ulong)uVar2 << 0x20;
}

Assistant:

uint64_t HELPER(neon_abdl_u16)(uint32_t a, uint32_t b)
{
    uint64_t tmp;
    uint64_t result;
    DO_ABD(result, a, b, uint8_t, uint32_t);
    DO_ABD(tmp, a >> 8, b >> 8, uint8_t, uint32_t);
    result |= tmp << 16;
    DO_ABD(tmp, a >> 16, b >> 16, uint8_t, uint32_t);
    result |= tmp << 32;
    DO_ABD(tmp, a >> 24, b >> 24, uint8_t, uint32_t);
    result |= tmp << 48;
    return result;
}